

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O0

void __thiscall
ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,FunctionDefinition *e)

{
  bool bVar1;
  pointer pFVar2;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *this_00;
  pointer pFVar3;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *this_01;
  pointer this_02;
  Block *this_03;
  string *psVar4;
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  local_68;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_60;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_58;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  argument_value;
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  *argument;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *__range1;
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  definition_copy;
  FunctionDefinition *e_local;
  DefaultEvaluator *this_local;
  
  definition_copy._M_t.
  super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>._M_head_impl =
       (__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
        )(__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
          )e;
  parser::element::ASTElement::clone<ninx::parser::element::FunctionDefinition>
            ((ASTElement *)&__range1);
  pFVar2 = std::
           unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
           ::operator->((unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                         *)&__range1);
  this_00 = parser::element::FunctionDefinition::get_arguments(pFVar2);
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ::begin(this_00);
  argument = (unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
              *)std::
                vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
                                     *)&argument), bVar1) {
    argument_value._M_t.
    super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
    ._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
    .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
         (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
           ::operator*(&__end1);
    reset_return_block();
    pFVar3 = std::
             unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ::operator->((unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                           *)argument_value._M_t.
                             super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
                             .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>.
                             _M_head_impl);
    (*(pFVar3->super_ASTElement)._vptr_ASTElement[2])(pFVar3,this);
    get_owned_return_block();
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_58);
    if (bVar1) {
      pFVar2 = std::
               unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
               ::operator->((unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                             *)&__range1);
      this_01 = parser::element::FunctionDefinition::get_body(pFVar2);
      this_02 = std::
                unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                ::operator->(this_01);
      pFVar3 = std::
               unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
               ::operator->((unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                             *)argument_value._M_t.
                               super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
                               .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>.
                               _M_head_impl);
      psVar4 = parser::element::FunctionArgument::get_name_abi_cxx11_(pFVar3);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      unique_ptr(&local_60,&local_58);
      parser::element::Block::set_variable(this_02,psVar4,&local_60,true);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      ~unique_ptr(&local_60);
    }
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr(&local_58);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>_>
    ::operator++(&__end1);
  }
  this_03 = parser::element::ASTElement::get_parent
                      ((ASTElement *)
                       definition_copy._M_t.
                       super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                       .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>.
                       _M_head_impl);
  psVar4 = parser::element::FunctionDefinition::get_name_abi_cxx11_
                     ((FunctionDefinition *)
                      definition_copy._M_t.
                      super___uniq_ptr_impl<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ninx::parser::element::FunctionDefinition_*,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                      .super__Head_base<0UL,_ninx::parser::element::FunctionDefinition_*,_false>.
                      _M_head_impl);
  std::
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ::unique_ptr(&local_68,
               (unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                *)&__range1);
  parser::element::Block::set_function(this_03,psVar4,&local_68);
  std::
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ::~unique_ptr(&local_68);
  std::
  unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                 *)&__range1);
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionDefinition *e) {
    auto definition_copy {e->clone<ninx::parser::element::FunctionDefinition>()};

    // Load all the function argument default as local variables in the function body block
    for (auto &argument : definition_copy->get_arguments()) {
        // Evaluate the argument
        reset_return_block();
        argument->accept(this);

        auto argument_value {get_owned_return_block()};
        // If the argument is non-null, copy the value
        if (argument_value) {
            definition_copy->get_body()->set_variable(argument->get_name(), std::move(argument_value), true);
        }
    }

    e->get_parent()->set_function(e->get_name(), std::move(definition_copy));
}